

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofSpring2Constraint::setParam
          (btGeneric6DofSpring2Constraint *this,int num,btScalar value,int axis)

{
  uint uVar1;
  int iVar2;
  
  if ((uint)axis < 3) {
    switch(num) {
    case 1:
      (this->m_linearLimits).m_motorERP.m_floats[(uint)axis] = value;
      goto LAB_0019549b;
    case 2:
      (this->m_linearLimits).m_stopERP.m_floats[(uint)axis] = value;
LAB_00195504:
      iVar2 = 2;
      break;
    case 3:
      (this->m_linearLimits).m_motorCFM.m_floats[(uint)axis] = value;
LAB_001954d8:
      iVar2 = 4;
      break;
    case 4:
      (this->m_linearLimits).m_stopCFM.m_floats[(uint)axis] = value;
LAB_001954ee:
      iVar2 = 1;
      break;
    default:
      goto switchD_00195456_default;
    }
  }
  else {
    uVar1 = axis - 3;
    if (2 < uVar1) {
      return;
    }
    switch(num) {
    case 1:
      this->m_angularLimits[uVar1].m_motorERP = value;
      break;
    case 2:
      this->m_angularLimits[uVar1].m_stopERP = value;
      goto LAB_00195504;
    case 3:
      this->m_angularLimits[uVar1].m_motorCFM = value;
      goto LAB_001954d8;
    case 4:
      this->m_angularLimits[uVar1].m_stopCFM = value;
      goto LAB_001954ee;
    default:
      goto switchD_00195456_default;
    }
LAB_0019549b:
    iVar2 = 8;
  }
  this->m_flags = this->m_flags | iVar2 << ((byte)(axis << 2) & 0x1f);
switchD_00195456_default:
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setParam(int num, btScalar value, int axis)
{
	if((axis >= 0) && (axis < 3))
	{
		switch(num)
		{
			case BT_CONSTRAINT_STOP_ERP : 
				m_linearLimits.m_stopERP[axis] = value;
				m_flags |= BT_6DOF_FLAGS_ERP_STOP2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			case BT_CONSTRAINT_STOP_CFM : 
				m_linearLimits.m_stopCFM[axis] = value;
				m_flags |= BT_6DOF_FLAGS_CFM_STOP2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			case BT_CONSTRAINT_ERP : 
				m_linearLimits.m_motorERP[axis] = value;
				m_flags |= BT_6DOF_FLAGS_ERP_MOTO2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			case BT_CONSTRAINT_CFM : 
				m_linearLimits.m_motorCFM[axis] = value;
				m_flags |= BT_6DOF_FLAGS_CFM_MOTO2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			default : 
				btAssertConstrParams(0);
		}
	}
	else if((axis >=3) && (axis < 6))
	{
		switch(num)
		{
			case BT_CONSTRAINT_STOP_ERP : 
				m_angularLimits[axis - 3].m_stopERP = value;
				m_flags |= BT_6DOF_FLAGS_ERP_STOP2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			case BT_CONSTRAINT_STOP_CFM : 
				m_angularLimits[axis - 3].m_stopCFM = value;
				m_flags |= BT_6DOF_FLAGS_CFM_STOP2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			case BT_CONSTRAINT_ERP : 
				m_angularLimits[axis - 3].m_motorERP = value;
				m_flags |= BT_6DOF_FLAGS_ERP_MOTO2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			case BT_CONSTRAINT_CFM : 
				m_angularLimits[axis - 3].m_motorCFM = value;
				m_flags |= BT_6DOF_FLAGS_CFM_MOTO2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2);
				break;
			default : 
				btAssertConstrParams(0);
		}
	}
	else
	{
		btAssertConstrParams(0);
	}
}